

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode urlencode_str(dynbuf *o,char *url,size_t len,_Bool relative,_Bool query)

{
  CURLcode CVar1;
  undefined1 local_47;
  char cStack_46;
  char local_45;
  CURLcode local_44;
  char out [3];
  uchar *puStack_40;
  CURLcode result;
  uchar *host_sep;
  uchar *iptr;
  _Bool left;
  _Bool query_local;
  size_t sStack_28;
  _Bool relative_local;
  size_t len_local;
  char *url_local;
  dynbuf *o_local;
  
  iptr._5_1_ = (query ^ 0xffU) & 1;
  puStack_40 = (uchar *)url;
  host_sep = (uchar *)url;
  sStack_28 = len;
  if (!relative) {
    puStack_40 = (uchar *)find_host_sep(url);
  }
  do {
    if (sStack_28 == 0) {
      return CURLUE_OK;
    }
    if (host_sep < puStack_40) {
      CVar1 = Curl_dyn_addn(o,host_sep,1);
      if (CVar1 != CURLE_OK) {
        if (CVar1 != CURLE_TOO_LARGE) {
          return CURLUE_OUT_OF_MEMORY;
        }
        return CURLUE_TOO_LARGE;
      }
      local_44 = CURLE_OK;
    }
    else if (*host_sep == ' ') {
      if (iptr._5_1_ == 0) {
        local_44 = Curl_dyn_addn(o,"+",1);
      }
      else {
        local_44 = Curl_dyn_addn(o,"%20",3);
      }
      if (local_44 != CURLE_OK) {
        if (local_44 != CURLE_TOO_LARGE) {
          return CURLUE_OUT_OF_MEMORY;
        }
        return CURLUE_TOO_LARGE;
      }
    }
    else {
      if (*host_sep == '?') {
        iptr._5_1_ = 0;
      }
      if ((((((*host_sep < 0x20) || (*host_sep == '\x7f')) || (*host_sep == ' ')) ||
           (*host_sep == '\t')) ||
          (((9 < *host_sep && (*host_sep < 0xe)) || ((8 < *host_sep && (*host_sep < 0xe)))))) ||
         ((0x20 < *host_sep && (*host_sep < 0x7f)))) {
        local_44 = Curl_dyn_addn(o,host_sep,1);
      }
      else {
        _local_47 = CONCAT11("0123456789abcdef"[(int)(uint)*host_sep >> 4],0x25);
        local_45 = "0123456789abcdef"[(int)(*host_sep & 0xf)];
        local_44 = Curl_dyn_addn(o,&local_47,3);
      }
      if (local_44 != CURLE_OK) {
        if (local_44 != CURLE_TOO_LARGE) {
          return CURLUE_OUT_OF_MEMORY;
        }
        return CURLUE_TOO_LARGE;
      }
    }
    host_sep = host_sep + 1;
    sStack_28 = sStack_28 - 1;
  } while( true );
}

Assistant:

static CURLUcode urlencode_str(struct dynbuf *o, const char *url,
                               size_t len, bool relative,
                               bool query)
{
  /* we must add this with whitespace-replacing */
  bool left = !query;
  const unsigned char *iptr;
  const unsigned char *host_sep = (const unsigned char *) url;
  CURLcode result;

  if(!relative)
    host_sep = (const unsigned char *) find_host_sep(url);

  for(iptr = (unsigned char *)url;    /* read from here */
      len; iptr++, len--) {

    if(iptr < host_sep) {
      result = Curl_dyn_addn(o, iptr, 1);
      if(result)
        return cc2cu(result);
      continue;
    }

    if(*iptr == ' ') {
      if(left)
        result = Curl_dyn_addn(o, "%20", 3);
      else
        result = Curl_dyn_addn(o, "+", 1);
      if(result)
        return cc2cu(result);
      continue;
    }

    if(*iptr == '?')
      left = FALSE;

    if(urlchar_needs_escaping(*iptr)) {
      char out[3]={'%'};
      out[1] = hexdigits[*iptr>>4];
      out[2] = hexdigits[*iptr & 0xf];
      result = Curl_dyn_addn(o, out, 3);
    }
    else
      result = Curl_dyn_addn(o, iptr, 1);
    if(result)
      return cc2cu(result);
  }

  return CURLUE_OK;
}